

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::rehash
          (Data<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *this,
          size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  void *pvVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  ulong uVar6;
  Node<unsigned_long_long,_QSslServerPrivate::SocketData> *pNVar7;
  ulong uVar8;
  size_t index;
  long lVar9;
  Span *pSVar10;
  size_t numBuckets;
  long lVar11;
  R RVar12;
  Bucket BVar13;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar12 = allocateSpans(numBuckets);
  this->spans = RVar12.spans;
  this->numBuckets = numBuckets;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    pSVar10 = pSVar2;
    do {
      lVar9 = 0;
      do {
        if ((ulong)pSVar10->offsets[lVar9] != 0xff) {
          key = pSVar2[uVar8].entries + pSVar10->offsets[lVar9];
          uVar6 = *(ulong *)(key->storage).data ^ this->seed;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
          BVar13 = findBucketWithHash<unsigned_long_long>
                             (this,(unsigned_long_long *)key,uVar6 >> 0x20 ^ uVar6);
          pNVar7 = Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::
                   insert(BVar13.span,BVar13.index);
          pNVar7->key = *(unsigned_long_long *)(key->storage).data;
          pvVar3 = *(void **)((key->storage).data + 8);
          (key->storage).data[8] = '\0';
          (key->storage).data[9] = '\0';
          (key->storage).data[10] = '\0';
          (key->storage).data[0xb] = '\0';
          (key->storage).data[0xc] = '\0';
          (key->storage).data[0xd] = '\0';
          (key->storage).data[0xe] = '\0';
          (key->storage).data[0xf] = '\0';
          (pNVar7->value).readyReadConnection.d_ptr = pvVar3;
          pvVar3 = *(void **)((key->storage).data + 0x10);
          peVar5 = *(element_type **)((key->storage).data + 0x18);
          (key->storage).data[0x10] = '\0';
          (key->storage).data[0x11] = '\0';
          (key->storage).data[0x12] = '\0';
          (key->storage).data[0x13] = '\0';
          (key->storage).data[0x14] = '\0';
          (key->storage).data[0x15] = '\0';
          (key->storage).data[0x16] = '\0';
          (key->storage).data[0x17] = '\0';
          (pNVar7->value).destroyedConnection.d_ptr = pvVar3;
          (pNVar7->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = peVar5;
          (pNVar7->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((key->storage).data + 0x20);
          (key->storage).data[0x20] = '\0';
          (key->storage).data[0x21] = '\0';
          (key->storage).data[0x22] = '\0';
          (key->storage).data[0x23] = '\0';
          (key->storage).data[0x24] = '\0';
          (key->storage).data[0x25] = '\0';
          (key->storage).data[0x26] = '\0';
          (key->storage).data[0x27] = '\0';
          (pNVar7->value).timeoutTimer.super___shared_ptr<QTimer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = p_Var4;
          (key->storage).data[0x18] = '\0';
          (key->storage).data[0x19] = '\0';
          (key->storage).data[0x1a] = '\0';
          (key->storage).data[0x1b] = '\0';
          (key->storage).data[0x1c] = '\0';
          (key->storage).data[0x1d] = '\0';
          (key->storage).data[0x1e] = '\0';
          (key->storage).data[0x1f] = '\0';
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::freeData
                (pSVar2 + uVar8);
      uVar8 = uVar8 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar8 != uVar1 >> 7);
  }
  lVar9 = *(long *)&pSVar2[-1].allocated;
  if (lVar9 != 0) {
    lVar11 = lVar9 * 0x90;
    do {
      Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_>::freeData
                ((Span<QHashPrivate::Node<unsigned_long_long,_QSslServerPrivate::SocketData>_> *)
                 (pSVar2[-1].offsets + lVar11));
      lVar11 = lVar11 + -0x90;
    } while (lVar11 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar9 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }